

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::mapSkeletonMetacharacters
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *patternForm,int32_t *flags,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  char16_t srcChar;
  char16_t cVar3;
  int32_t iVar4;
  DateTimePatternGenerator *__filename;
  bool bVar5;
  AllowedHourFormat local_d8;
  char16_t local_9c;
  char16_t local_9a;
  AllowedHourFormat preferred;
  UChar dayPeriodChar;
  UChar hourChar;
  int32_t dayPeriodLen;
  int32_t hourLen;
  int32_t extraLen;
  int iStack_84;
  UChar patChr;
  int32_t patLen;
  int32_t patPos;
  UBool inQuoted;
  undefined1 local_70 [8];
  UnicodeString patternFormMapped;
  UErrorCode *status_local;
  int32_t *flags_local;
  UnicodeString *patternForm_local;
  DateTimePatternGenerator *this_local;
  
  __filename = this;
  patternFormMapped.fUnion._48_8_ = status;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70);
  icu_63::UnicodeString::remove((UnicodeString *)local_70,(char *)__filename);
  bVar2 = false;
  iVar4 = icu_63::UnicodeString::length(patternForm);
  iStack_84 = 0;
  do {
    if (iVar4 <= iStack_84) {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,(UnicodeString *)local_70);
LAB_003aa304:
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
      return __return_storage_ptr__;
    }
    srcChar = icu_63::UnicodeString::charAt(patternForm,iStack_84);
    if (srcChar == L'\'') {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (!bVar2) {
      if ((srcChar == L'j') || (srcChar == L'C')) {
        dayPeriodLen = 0;
        while( true ) {
          bVar5 = false;
          if (iStack_84 + 1 < iVar4) {
            cVar3 = icu_63::UnicodeString::charAt(patternForm,iStack_84 + 1);
            bVar5 = cVar3 == srcChar;
          }
          if (!bVar5) break;
          dayPeriodLen = dayPeriodLen + 1;
          iStack_84 = iStack_84 + 1;
        }
        _dayPeriodChar = (dayPeriodLen & 1U) + 1;
        if (dayPeriodLen < 2) {
          local_d8 = ALLOWED_HOUR_FORMAT_H;
        }
        else {
          local_d8 = (dayPeriodLen >> 1) + ALLOWED_HOUR_FORMAT_Hb;
        }
        preferred = local_d8;
        local_9a = L'h';
        local_9c = L'a';
        if (srcChar == L'j') {
          local_9a = this->fDefaultHourFormatChar;
        }
        else {
          if (this->fAllowedHourFormats[0] == -1) {
            *(undefined4 *)patternFormMapped.fUnion._48_8_ = 3;
            icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
            goto LAB_003aa304;
          }
          iVar1 = this->fAllowedHourFormats[0];
          if (((iVar1 == 1) || (iVar1 == 5)) || (iVar1 == 3)) {
            local_9a = L'H';
          }
          if ((iVar1 == 5) || (iVar1 == 4)) {
            local_9c = L'B';
          }
          else if ((iVar1 == 3) || (iVar1 == 2)) {
            local_9c = L'b';
          }
        }
        if ((local_9a == L'H') || (local_9a == L'k')) {
          preferred = ALLOWED_HOUR_FORMAT_h;
        }
        while (ALLOWED_HOUR_FORMAT_h < preferred) {
          icu_63::UnicodeString::append((UnicodeString *)local_70,local_9c);
          preferred = preferred + ALLOWED_HOUR_FORMAT_UNKNOWN;
        }
        while (0 < _dayPeriodChar) {
          icu_63::UnicodeString::append((UnicodeString *)local_70,local_9a);
          _dayPeriodChar = _dayPeriodChar + -1;
        }
      }
      else if (srcChar == L'J') {
        icu_63::UnicodeString::append((UnicodeString *)local_70,L'H');
        *flags = *flags | 2;
      }
      else {
        icu_63::UnicodeString::append((UnicodeString *)local_70,srcChar);
      }
    }
    iStack_84 = iStack_84 + 1;
  } while( true );
}

Assistant:

UnicodeString
DateTimePatternGenerator::mapSkeletonMetacharacters(const UnicodeString& patternForm, int32_t* flags, UErrorCode& status) {
    UnicodeString patternFormMapped;
    patternFormMapped.remove();
    UBool inQuoted = FALSE;
    int32_t patPos, patLen = patternForm.length();
    for (patPos = 0; patPos < patLen; patPos++) {
        UChar patChr = patternForm.charAt(patPos);
        if (patChr == SINGLE_QUOTE) {
            inQuoted = !inQuoted;
        } else if (!inQuoted) {
            // Handle special mappings for 'j' and 'C' in which fields lengths
            // 1,3,5 => hour field length 1
            // 2,4,6 => hour field length 2
            // 1,2 => abbreviated dayPeriod (field length 1..3)
            // 3,4 => long dayPeriod (field length 4)
            // 5,6 => narrow dayPeriod (field length 5)
            if (patChr == LOW_J || patChr == CAP_C) {
                int32_t extraLen = 0; // 1 less than total field length
                while (patPos+1 < patLen && patternForm.charAt(patPos+1)==patChr) {
                    extraLen++;
                    patPos++;
                }
                int32_t hourLen = 1 + (extraLen & 1);
                int32_t dayPeriodLen = (extraLen < 2)? 1: 3 + (extraLen >> 1);
                UChar hourChar = LOW_H;
                UChar dayPeriodChar = LOW_A;
                if (patChr == LOW_J) {
                    hourChar = fDefaultHourFormatChar;
                } else {
                    AllowedHourFormat preferred;
                    if (fAllowedHourFormats[0] != ALLOWED_HOUR_FORMAT_UNKNOWN) {
                        preferred = (AllowedHourFormat)fAllowedHourFormats[0];
                    } else {
                        status = U_INVALID_FORMAT_ERROR;
                        return UnicodeString();
                    }
                    if (preferred == ALLOWED_HOUR_FORMAT_H || preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_Hb) {
                        hourChar = CAP_H;
                    }
                    // in #13183 just add b/B to skeleton, no longer need to set special flags
                    if (preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_hB) {
                        dayPeriodChar = CAP_B;
                    } else if (preferred == ALLOWED_HOUR_FORMAT_Hb || preferred == ALLOWED_HOUR_FORMAT_hb) {
                        dayPeriodChar = LOW_B;
                    }
                }
                if (hourChar==CAP_H || hourChar==LOW_K) {
                    dayPeriodLen = 0;
                }
                while (dayPeriodLen-- > 0) {
                    patternFormMapped.append(dayPeriodChar);
                }
                while (hourLen-- > 0) {
                    patternFormMapped.append(hourChar);
                }
            } else if (patChr == CAP_J) {
                // Get pattern for skeleton with H, then replace H or k
                // with fDefaultHourFormatChar (if different)
                patternFormMapped.append(CAP_H);
                *flags |= kDTPGSkeletonUsesCapJ;
            } else {
                patternFormMapped.append(patChr);
            }
        }
    }
    return patternFormMapped;
}